

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O0

bitwidth_t __thiscall slang::SVInt::countLeadingZs(SVInt *this)

{
  bool bVar1;
  uint32_t uVar2;
  _If_is_unsigned_integer<unsigned_long,_int> _Var3;
  SVInt *in_RDI;
  uint64_t elem;
  bitwidth_t count;
  int i;
  int words;
  uint32_t shift;
  bitwidth_t bitsInMsw;
  uint local_24;
  int local_20;
  uint local_14;
  uint local_4;
  
  bVar1 = hasUnknown(in_RDI);
  if (bVar1) {
    local_14 = (in_RDI->super_SVIntStorage).bitWidth & 0x3f;
    if (local_14 == 0) {
      local_14 = 0x40;
    }
    uVar2 = getNumWords((in_RDI->super_SVIntStorage).bitWidth,false);
    local_24 = std::countl_one<unsigned_long>(0x58e37b);
    if (local_24 == local_14) {
      for (local_20 = uVar2 - 2; -1 < local_20; local_20 = local_20 + -1) {
        if (((in_RDI->super_SVIntStorage).field_0.pVal[(int)(local_20 + uVar2)] &
            (in_RDI->super_SVIntStorage).field_0.pVal[local_20]) != 0xffffffffffffffff) {
          _Var3 = std::countl_one<unsigned_long>(0x58e3e1);
          local_24 = _Var3 + local_24;
          break;
        }
        local_24 = local_24 + 0x40;
      }
    }
    local_4 = local_24;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

bitwidth_t SVInt::countLeadingZs() const {
    if (!hasUnknown())
        return 0;

    bitwidth_t bitsInMsw = bitWidth % BITS_PER_WORD;
    uint32_t shift = 0;
    if (!bitsInMsw)
        bitsInMsw = BITS_PER_WORD;
    else
        shift = BITS_PER_WORD - bitsInMsw;

    int words = (int)getNumWords(bitWidth, false);
    int i = words - 1;
    bitwidth_t count = (bitwidth_t)std::countl_one((pVal[i + words] & pVal[i]) << shift);
    if (count == bitsInMsw) {
        for (i--; i >= 0; i--) {
            auto elem = pVal[i + words] & pVal[i];
            if (elem == UINT64_MAX)
                count += BITS_PER_WORD;
            else {
                count += (bitwidth_t)std::countl_one(elem);
                break;
            }
        }
    }

    return count;
}